

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

function<void_(TcpSocket_*,_void_*)> * __thiscall
TcpSocketImpl::BindFuncBytesReceived
          (function<void_(TcpSocket_*,_void_*)> *__return_storage_ptr__,TcpSocketImpl *this,
          function<void_(TcpSocket_*,_void_*)> *fBytesReceived)

{
  function<void_(TcpSocket_*,_void_*)> *fBytesReceived_local;
  TcpSocketImpl *this_local;
  
  std::function<void_(TcpSocket_*,_void_*)>::swap(&this->m_fBytesReceivedParam,fBytesReceived);
  std::function<void_(TcpSocket_*,_void_*)>::function(__return_storage_ptr__,fBytesReceived);
  return __return_storage_ptr__;
}

Assistant:

function<void(TcpSocket*, void*)> TcpSocketImpl::BindFuncBytesReceived(function<void(TcpSocket*, void*)> fBytesReceived) noexcept
{
    m_fBytesReceivedParam.swap(fBytesReceived);
    return fBytesReceived;
}